

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

void __thiscall
Clasp::MinimizeBuilder::mergeLevels(MinimizeBuilder *this,SumVec *adjust,WeightVec *weights)

{
  pointer pMVar1;
  pointer pLVar2;
  long *plVar3;
  size_type sVar4;
  int iVar5;
  uint uVar6;
  MLit *__seed;
  pointer pMVar7;
  weight_t wVar8;
  ulong uVar9;
  pointer pMVar10;
  pointer pMVar11;
  pointer pMVar12;
  _Temporary_buffer<Clasp::MinimizeBuilder::MLit_*,_Clasp::MinimizeBuilder::MLit> local_58;
  MinimizeBuilder *local_40;
  SumVec *local_38;
  
  uVar9 = (ulong)(this->lits_).ebo_.size;
  local_38 = adjust;
  if (uVar9 != 0) {
    __seed = (this->lits_).ebo_.buf;
    std::_Temporary_buffer<Clasp::MinimizeBuilder::MLit_*,_Clasp::MinimizeBuilder::MLit>::
    _Temporary_buffer(&local_58,__seed,uVar9 + 1 >> 1);
    if (local_58._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<Clasp::MinimizeBuilder::MLit*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpLit>>
                (__seed,__seed + uVar9);
    }
    else {
      std::
      __stable_sort_adaptive<Clasp::MinimizeBuilder::MLit*,Clasp::MinimizeBuilder::MLit*,long,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpLit>>
                (__seed,__seed + uVar9,local_58._M_buffer,local_58._M_len);
    }
    operator_delete(local_58._M_buffer);
  }
  pMVar11 = (this->lits_).ebo_.buf;
  (weights->ebo_).size = 0;
  bk_lib::
  pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
  ::reserve(weights,(this->lits_).ebo_.size);
  uVar9 = (ulong)(this->lits_).ebo_.size;
  local_40 = this;
  if (uVar9 != 0) {
    pMVar10 = (this->lits_).ebo_.buf;
    pMVar1 = pMVar10 + uVar9;
    do {
      sVar4 = (weights->ebo_).size;
      local_58._M_original_len._4_4_ = pMVar10->weight;
      local_58._M_original_len._0_4_ = pMVar10->prio & 0x7fffffff;
      bk_lib::
      pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
      ::push_back(weights,(LevelWeight *)&local_58);
      pMVar12 = pMVar10;
      while ((pMVar7 = pMVar12, pMVar12 = pMVar7 + 1, pMVar12 != pMVar1 &&
             (((pMVar10->lit).rep_ ^ (pMVar12->lit).rep_) < 4))) {
        pLVar2 = (weights->ebo_).buf + ((weights->ebo_).size - 1);
        *(uint *)pLVar2 = *(uint *)pLVar2 | 0x80000000;
        local_58._M_original_len._4_4_ = pMVar7[1].weight;
        local_58._M_original_len._0_4_ = pMVar7[1].prio & 0x7fffffff;
        bk_lib::
        pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
        ::push_back(weights,(LevelWeight *)&local_58);
        if (((byte)(pMVar12->lit).rep_ & 2) >> 1 != ((byte)(pMVar10->lit).rep_ & 2) >> 1) {
          iVar5 = pMVar7[1].weight;
          plVar3 = (local_38->ebo_).buf + (uint)pMVar7[1].prio;
          *plVar3 = *plVar3 + (long)iVar5;
          (weights->ebo_).buf[(weights->ebo_).size - 1].weight = -iVar5;
        }
      }
      pMVar11->weight = pMVar10->weight;
      wVar8 = pMVar10->prio;
      pMVar11->lit = (Literal)(pMVar10->lit).rep_;
      pMVar11->prio = wVar8;
      pMVar11->weight = sVar4;
      pMVar11 = pMVar11 + 1;
      pMVar10 = pMVar12;
    } while (pMVar12 != pMVar1);
  }
  uVar6 = (local_40->lits_).ebo_.size;
  (local_40->lits_).ebo_.size =
       (int)((long)(local_40->lits_).ebo_.buf + ((ulong)uVar6 * 0xc - (long)pMVar11) >> 2) *
       0x55555555 + uVar6;
  return;
}

Assistant:

void MinimizeBuilder::mergeLevels(SumVec& adjust, SharedData::WeightVec& weights) {
	// group first by variables and then by increasing levels
	std::stable_sort(lits_.begin(), lits_.end(), CmpLit());
	LitVec::iterator j = lits_.begin();
	weights.clear(); weights.reserve(lits_.size());
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(), k; it != end; it = k) {
		// handle first occurrence of var
		assert(it->weight > 0 && "most important occurrence of lit must have positive weight");
		weight_t wpos = (weight_t)weights.size();
		weights.push_back(SharedData::LevelWeight(it->prio, it->weight));
		// handle remaining occurrences with lower prios
		for (k = it + 1; k != end && k->lit.var() == it->lit.var(); ++k) {
			assert(k->prio > it->prio && "levels not prepared!");
			weights.back().next = 1;
			weights.push_back(SharedData::LevelWeight(k->prio, k->weight));
			if (k->lit.sign() != it->lit.sign()) {
				adjust[k->prio] += k->weight;
				weights.back().weight = -k->weight;
			}
		}
		(*j = *it).weight = wpos;
		++j;
	}
	lits_.erase(j, lits_.end());
}